

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O3

void work_gga_fxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  undefined1 auVar172 [16];
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  undefined1 auVar173 [16];
  double dVar179;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  double __x;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  undefined1 auVar199 [16];
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  undefined1 auVar223 [16];
  double dVar232;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar250;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  undefined1 auVar278 [16];
  double dVar285;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  undefined1 auVar304 [16];
  double dVar311;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  double dVar335;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  double dVar350;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  undefined1 auVar359 [16];
  double dVar360;
  double dVar361;
  double dVar362;
  double dVar363;
  double dVar373;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  double dVar374;
  double dVar375;
  double dVar376;
  double dVar377;
  undefined1 auVar378 [16];
  double local_d28;
  double local_bd0;
  double local_5f8;
  double local_5e8;
  double local_548;
  double dStack_540;
  double local_538;
  double dStack_530;
  double local_438;
  double local_428;
  
  if (np != 0) {
    sVar10 = 0;
    local_bd0 = 0.0;
    local_d28 = 0.0;
    do {
      lVar8 = (long)(p->dim).rho * sVar10;
      dVar18 = rho[lVar8];
      if (p->nspin == 2) {
        dVar18 = dVar18 + rho[lVar8 + 1];
      }
      dVar377 = p->dens_threshold;
      if (dVar377 <= dVar18) {
        lVar9 = (long)(p->dim).sigma * sVar10;
        dVar18 = rho[lVar8];
        if (rho[lVar8] <= dVar377) {
          dVar18 = dVar377;
        }
        dVar19 = p->sigma_threshold * p->sigma_threshold;
        dVar120 = sigma[lVar9];
        if (sigma[lVar9] <= dVar19) {
          dVar120 = dVar19;
        }
        if (p->nspin == 2) {
          local_d28 = rho[lVar8 + 1];
          if (rho[lVar8 + 1] <= dVar377) {
            local_d28 = dVar377;
          }
          local_bd0 = sigma[lVar9 + 2];
          if (sigma[lVar9 + 2] <= dVar19) {
            local_bd0 = dVar19;
          }
        }
        pdVar2 = (double *)p->params;
        __x = dVar18 + local_d28;
        dVar138 = 1.0 / __x;
        dVar205 = (dVar18 + dVar18) * dVar138;
        dVar19 = p->zeta_threshold;
        dVar180 = dVar19 + -1.0;
        dVar251 = (local_d28 + local_d28) * dVar138;
        dVar20 = dVar18 - local_d28;
        uVar11 = -(ulong)(dVar251 <= dVar19);
        uVar12 = -(ulong)(dVar205 <= dVar19);
        dVar57 = (double)(uVar12 & (ulong)dVar180 |
                         ~uVar12 & (~uVar11 & (ulong)(dVar20 * dVar138) | (ulong)-dVar180 & uVar11))
        ;
        dVar81 = dVar57 + 1.0;
        dVar21 = cbrt(dVar19);
        dVar22 = cbrt(dVar81);
        uVar13 = -(ulong)(dVar81 <= dVar19);
        dVar23 = (double)(uVar13 & (ulong)(dVar21 * dVar19) | ~uVar13 & (ulong)(dVar22 * dVar81)) *
                 0.9847450218426964;
        dVar24 = cbrt(__x);
        dVar82 = pdVar2[2] * dVar120;
        dVar83 = dVar18 * dVar18;
        dVar25 = cbrt(dVar18);
        dVar139 = 1.0 / dVar25;
        dVar84 = 1.0 / (dVar25 * dVar25);
        dVar85 = dVar84 / dVar83;
        dVar181 = pdVar2[3] * dVar120 * dVar120;
        dVar206 = dVar83 * dVar83;
        dVar140 = dVar139 / (dVar18 * dVar206);
        dVar141 = dVar82 * dVar85 + dVar181 * dVar140 + 1.0;
        dVar25 = (-1.0 / dVar141 + 1.0) * pdVar2[1];
        dVar142 = pdVar2[4] * dVar120;
        dVar143 = dVar142 * dVar85 + 1.0;
        dVar86 = -1.0 / dVar143 + 1.0;
        dVar26 = dVar25 * dVar86 + *pdVar2;
        dVar27 = cbrt(0.3183098861837907);
        dVar87 = 1.0 / dVar27;
        dVar88 = dVar87 * 1.5874010519681996 * 6.534776057350833;
        dVar89 = dVar88 / dVar26;
        if (dVar89 < 0.0) {
          dVar28 = sqrt(dVar89);
        }
        else {
          dVar28 = SQRT(dVar89);
        }
        dVar90 = p->cam_omega / dVar28;
        dVar29 = cbrt(__x * dVar81);
        dVar29 = 1.0 / dVar29;
        dVar30 = dVar29 * 1.2599210498948732;
        dVar182 = dVar90 * dVar30 * 0.5;
        dVar144 = 1.35;
        if (dVar182 <= 1.35) {
          dVar144 = dVar182;
        }
        dVar31 = 1.0 / dVar144;
        dVar32 = erf(dVar31 * 0.5);
        dVar91 = dVar144 * dVar144;
        dVar33 = 1.0 / dVar91;
        dVar34 = exp(dVar33 * -0.25);
        dVar68 = dVar182;
        if (dVar182 <= 1.35) {
          dVar68 = 1.35;
        }
        dVar312 = dVar68 * dVar68;
        dVar323 = dVar312 * dVar312;
        dVar252 = 1.0 / (dVar312 * dVar323);
        dVar92 = dVar323 * dVar323;
        auVar278._0_8_ = dVar92 * dVar92;
        auVar278._8_8_ = dVar92;
        auVar278 = divpd(_DAT_01025040,auVar278);
        dVar270 = auVar278._0_8_;
        dVar285 = auVar278._8_8_;
        auVar304._8_8_ = dVar323;
        auVar304._0_8_ = dVar312;
        auVar69._8_8_ = dVar285;
        auVar69._0_8_ = dVar285;
        auVar304 = divpd(auVar69,auVar304);
        dVar207 = dVar285 / (dVar312 * dVar323);
        dVar145 = dVar34 + -1.0;
        dVar183 = dVar91 * -2.0 * dVar145 + dVar34 + -1.5;
        dVar92 = dVar144 + dVar144;
        dVar32 = dVar92 * dVar183 + dVar32 * 1.7724538509055159;
        dVar184 = 1.0 / dVar323;
        if (dVar182 < 1.35) {
          dVar35 = dVar144 * -2.6666666666666665 * dVar32 + 1.0;
        }
        else {
          auVar121._0_8_ = 1.0 / dVar312;
          auVar121._8_8_ = dVar184;
          auVar69 = divpd(auVar121,_DAT_010339c0);
          auVar172._8_8_ = dVar285;
          auVar172._0_8_ = dVar252;
          auVar121 = divpd(auVar172,_DAT_010339d0);
          auVar172 = divpd(auVar304,_DAT_010339e0);
          auVar199._8_8_ = dVar270;
          auVar199._0_8_ = dVar207;
          auVar199 = divpd(auVar199,_DAT_010339f0);
          dVar35 = ((((((auVar69._0_8_ - auVar69._8_8_) + auVar121._0_8_) - auVar121._8_8_) +
                     auVar172._0_8_) - auVar172._8_8_) + auVar199._0_8_) - auVar199._8_8_;
        }
        dVar40 = p->cam_beta;
        dVar41 = p->cam_alpha;
        dVar36 = dVar23 * -0.375;
        dVar1 = p->dens_threshold;
        dVar146 = -dVar20;
        dVar62 = (double)((ulong)dVar180 & uVar11 |
                         ~uVar11 & ((ulong)-dVar180 & uVar12 | ~uVar12 & (ulong)(dVar138 * dVar146))
                         );
        dVar93 = dVar62 + 1.0;
        dVar180 = p->zeta_threshold;
        dVar37 = cbrt(dVar93);
        uVar14 = -(ulong)(dVar93 <= dVar180);
        dVar21 = (double)((ulong)(dVar21 * dVar19) & uVar14 | ~uVar14 & (ulong)(dVar93 * dVar37)) *
                 0.9847450218426964;
        dVar94 = pdVar2[2] * local_bd0;
        dVar95 = local_d28 * local_d28;
        dVar38 = cbrt(local_d28);
        dVar185 = 1.0 / dVar38;
        dVar147 = 1.0 / (dVar38 * dVar38);
        dVar148 = dVar147 / dVar95;
        dVar208 = pdVar2[3] * local_bd0 * local_bd0;
        dVar233 = dVar95 * dVar95;
        dVar186 = dVar185 / (local_d28 * dVar233);
        dVar187 = dVar94 * dVar148 + dVar208 * dVar186 + 1.0;
        dVar188 = (1.0 - 1.0 / dVar187) * pdVar2[1];
        dVar38 = pdVar2[4] * local_bd0;
        dVar209 = dVar38 * dVar148 + 1.0;
        dVar149 = 1.0 - 1.0 / dVar209;
        dVar189 = dVar188 * dVar149 + *pdVar2;
        dVar88 = dVar88 / dVar189;
        if (dVar88 < 0.0) {
          dVar150 = sqrt(dVar88);
        }
        else {
          dVar150 = SQRT(dVar88);
        }
        dVar39 = dVar24 * dVar26;
        dVar40 = (-dVar40 * dVar35 - dVar41) + 1.0;
        dVar41 = p->cam_omega / dVar150;
        dVar42 = cbrt(__x * dVar93);
        dVar42 = 1.0 / dVar42;
        dVar43 = dVar42 * 1.2599210498948732;
        dVar151 = dVar41 * dVar43 * 0.5;
        dVar35 = 1.35;
        if (dVar151 <= 1.35) {
          dVar35 = dVar151;
        }
        dVar44 = 1.0 / dVar35;
        dVar45 = erf(dVar44 * 0.5);
        dVar96 = dVar35 * dVar35;
        dVar46 = 1.0 / dVar96;
        dVar47 = exp(dVar46 * -0.25);
        dVar54 = dVar151;
        if (dVar151 <= 1.35) {
          dVar54 = 1.35;
        }
        dVar351 = dVar54 * dVar54;
        dVar361 = dVar351 * dVar351;
        dVar210 = 1.0 / (dVar351 * dVar361);
        dVar97 = dVar361 * dVar361;
        auVar201._0_8_ = dVar97 * dVar97;
        auVar201._8_8_ = dVar97;
        auVar69 = divpd(_DAT_01025040,auVar201);
        dVar234 = auVar69._0_8_;
        dVar250 = auVar69._8_8_;
        auVar173._8_8_ = dVar361;
        auVar173._0_8_ = dVar351;
        auVar330._8_8_ = dVar250;
        auVar330._0_8_ = dVar250;
        auVar121 = divpd(auVar330,auVar173);
        dVar295 = dVar250 / (dVar351 * dVar361);
        dVar152 = dVar47 + -1.0;
        dVar98 = dVar96 * -2.0 * dVar152 + dVar47 + -1.5;
        dVar97 = dVar35 + dVar35;
        dVar286 = dVar45 * 1.7724538509055159 + dVar97 * dVar98;
        dVar45 = 1.0 / dVar361;
        if (dVar151 < 1.35) {
          dVar48 = dVar35 * -2.6666666666666665 * dVar286 + 1.0;
        }
        else {
          auVar70._0_8_ = 1.0 / dVar351;
          auVar70._8_8_ = dVar45;
          auVar172 = divpd(auVar70,_DAT_010339c0);
          auVar122._8_8_ = dVar250;
          auVar122._0_8_ = dVar210;
          auVar199 = divpd(auVar122,_DAT_010339d0);
          auVar173 = divpd(auVar121,_DAT_010339e0);
          auVar200._8_8_ = dVar234;
          auVar200._0_8_ = dVar295;
          auVar201 = divpd(auVar200,_DAT_010339f0);
          dVar48 = ((((((auVar172._0_8_ - auVar172._8_8_) + auVar199._0_8_) - auVar199._8_8_) +
                     auVar173._0_8_) - auVar173._8_8_) + auVar201._0_8_) - auVar201._8_8_;
        }
        dVar190 = dVar39 * dVar40;
        uVar15 = -(ulong)(dVar18 <= dVar377);
        dVar99 = dVar24 * dVar189;
        dVar191 = (-p->cam_beta * dVar48 - p->cam_alpha) + 1.0;
        dVar100 = dVar99 * dVar191;
        dVar48 = dVar21 * -0.375;
        uVar16 = -(ulong)(local_d28 <= dVar1);
        dVar101 = (double)(~uVar16 & (ulong)(dVar48 * dVar100)) +
                  (double)(~uVar15 & (ulong)(dVar36 * dVar190));
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar8 = (long)(p->dim).zk * sVar10;
          pdVar3[lVar8] = pdVar3[lVar8] + dVar101;
        }
        dVar102 = __x * __x;
        dVar49 = 1.0 / dVar102;
        bVar4 = dVar19 < dVar251;
        bVar5 = dVar19 < dVar205;
        dVar324 = 0.0;
        if (bVar5 && bVar4) {
          dVar324 = dVar138 - dVar20 * dVar49;
        }
        dVar352 = 1.0 / (dVar24 * dVar24);
        dVar153 = pdVar2[1] / (dVar141 * dVar141);
        dVar271 = dVar84 / (dVar18 * dVar83);
        dVar103 = dVar139 / (dVar83 * dVar206);
        dVar235 = dVar82 * -2.6666666666666665 * dVar271 + dVar181 * -5.333333333333333 * dVar103;
        dVar104 = 1.0 / (dVar143 * dVar143);
        dVar236 = dVar235 * dVar86 * dVar153 +
                  dVar104 * dVar25 * -2.6666666666666665 * dVar142 * dVar271;
        auVar290._0_8_ = dVar323 * dVar68;
        auVar290._8_8_ = dVar312 * dVar68;
        dVar89 = (p->cam_omega / dVar28) / dVar89;
        dVar105 = dVar30 * dVar89 * 3.141592653589793;
        dVar50 = dVar87 * 2.080083823051904;
        dVar296 = dVar26 * dVar26;
        dVar154 = 1.0 / dVar296;
        dVar155 = dVar154 * 1.5874010519681996;
        dVar272 = (dVar29 / (__x * dVar81)) * 1.2599210498948732;
        dVar297 = dVar324 * __x + dVar57 + 1.0;
        dVar51 = dVar50 * dVar105;
        dVar298 = (dVar297 * dVar90 * dVar272) / -6.0 + dVar155 * dVar236 * dVar51 * 0.25;
        auVar279._8_8_ = dVar323 * auVar290._8_8_;
        auVar279._0_8_ = dVar68;
        dVar106 = dVar22 * 1.3333333333333333;
        dVar353 = dVar352 * dVar26;
        dVar323 = dVar353 * dVar40;
        dVar354 = dVar23 * dVar323 * 0.125;
        uVar17 = -(ulong)(1.35 < dVar182);
        dVar211 = (double)(uVar17 & (ulong)dVar298);
        auVar223._8_8_ = 0x3ff0000000000000;
        auVar223._0_8_ = dVar285;
        dVar68 = 0.0;
        if (dVar182 <= 1.35) {
          dVar68 = dVar298;
        }
        dVar325 = 1.0 / auVar290._8_8_;
        dVar298 = 1.0 / auVar290._0_8_;
        auVar172 = divpd(auVar223,auVar279);
        auVar6._8_8_ = dVar285;
        auVar6._0_8_ = dVar285;
        auVar199 = divpd(auVar6,auVar290);
        dVar311 = auVar199._8_8_;
        auVar278 = divpd(auVar278,auVar279);
        dVar212 = auVar172._0_8_;
        dVar232 = auVar172._8_8_;
        dVar237 = 1.0 / (dVar144 * dVar91);
        dVar253 = dVar145 * dVar144 * -4.0;
        dVar254 = (dVar253 * dVar68 + dVar237 * dVar68 * dVar34 * 0.5) - dVar68 * dVar31 * dVar34;
        dVar273 = dVar68 + dVar68;
        dVar238 = -dVar34 * dVar33;
        dVar239 = dVar238 * dVar68 + dVar92 * dVar254 + dVar183 * dVar273;
        dVar179 = auVar278._8_8_;
        dVar299 = auVar199._0_8_;
        dVar156 = auVar278._0_8_;
        if (dVar182 < 1.35) {
          dVar313 = dVar144 * -2.6666666666666665 * dVar239 + dVar68 * -2.6666666666666665 * dVar32;
        }
        else {
          auVar331._0_8_ = -dVar325 * dVar211;
          auVar331._8_8_ = dVar298 * dVar211;
          auVar173 = divpd(auVar331,_DAT_01033a00);
          auVar263._0_8_ = dVar212 * dVar211;
          auVar263._8_8_ = dVar232 * dVar211;
          auVar278 = divpd(auVar263,_DAT_01033a10);
          auVar305._0_8_ = dVar299 * dVar211;
          auVar305._8_8_ = dVar311 * dVar211;
          auVar199 = divpd(auVar305,_DAT_01033a20);
          auVar291._0_8_ = dVar211 * dVar156;
          auVar291._8_8_ = dVar211 * dVar179;
          auVar172 = divpd(auVar291,_DAT_01033a30);
          dVar313 = ((((((auVar173._8_8_ + auVar173._0_8_) - auVar278._8_8_) + auVar278._0_8_) -
                      auVar199._8_8_) + auVar199._0_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar192 = (double)(~uVar13 & (ulong)(dVar106 * dVar324 * 0.9847450218426964));
        dVar107 = dVar24 * dVar236;
        dVar193 = dVar40 * dVar107;
        dVar313 = dVar313 * p->cam_beta;
        dVar108 = dVar39 * dVar313;
        dVar194 = 0.0;
        dVar274 = 0.0;
        if (dVar377 < dVar18) {
          dVar274 = dVar23 * 0.375 * dVar108 +
                    ((dVar192 * -0.375 * dVar190 - dVar354) - dVar23 * 0.375 * dVar193);
        }
        if (dVar19 < dVar251) {
          dVar194 = (double)(~uVar12 & (ulong)(-dVar138 - dVar49 * dVar146));
        }
        dVar314 = dVar37 * 1.3333333333333333;
        dVar251 = dVar352 * dVar189;
        dVar52 = dVar251 * dVar191;
        dVar300 = dVar21 * dVar52 * 0.125;
        auVar123._0_8_ = dVar361 * dVar54;
        auVar123._8_8_ = dVar351 * dVar54;
        dVar53 = (dVar42 / (__x * dVar93)) * 1.2599210498948732;
        dVar157 = dVar194 * __x + dVar62 + 1.0;
        dVar255 = dVar41 * dVar53;
        dVar256 = (dVar255 * dVar157) / -6.0;
        local_5f8 = dVar256;
        if (dVar151 <= 1.35) {
          local_5f8 = 0.0;
        }
        dVar158 = 1.0 / auVar123._8_8_;
        dVar240 = 1.0 / auVar123._0_8_;
        auVar332._8_8_ = 0x3ff0000000000000;
        auVar332._0_8_ = dVar250;
        auVar341._8_8_ = dVar361 * auVar123._8_8_;
        auVar341._0_8_ = dVar54;
        auVar172 = divpd(auVar332,auVar341);
        dVar335 = auVar172._8_8_;
        auVar7._8_8_ = dVar250;
        auVar7._0_8_ = dVar250;
        auVar199 = divpd(auVar7,auVar123);
        dVar373 = auVar199._8_8_;
        auVar278 = divpd(auVar69,auVar341);
        uVar12 = -(ulong)(1.35 < dVar151);
        dVar256 = (double)(~uVar12 & (ulong)dVar256);
        dVar257 = 1.0 / (dVar35 * dVar96);
        dVar213 = dVar152 * dVar35 * -4.0;
        dVar336 = (dVar213 * dVar256 + dVar257 * dVar256 * dVar47 * 0.5) - dVar256 * dVar44 * dVar47
        ;
        dVar214 = dVar256 + dVar256;
        dVar258 = -dVar47 * dVar46;
        dVar337 = dVar256 * dVar258 + dVar97 * dVar336 + dVar98 * dVar214;
        dVar361 = auVar278._8_8_;
        dVar326 = auVar172._0_8_;
        dVar362 = auVar199._0_8_;
        dVar54 = auVar278._0_8_;
        if (dVar151 < 1.35) {
          dVar109 = dVar35 * -2.6666666666666665 * dVar337 + dVar256 * -2.6666666666666665 * dVar286
          ;
        }
        else {
          auVar174._0_8_ = -dVar158 * local_5f8;
          auVar174._8_8_ = dVar240 * local_5f8;
          auVar278 = divpd(auVar174,_DAT_01033a00);
          auVar333._0_8_ = dVar326 * local_5f8;
          auVar333._8_8_ = dVar335 * local_5f8;
          auVar69 = divpd(auVar333,_DAT_01033a10);
          auVar364._0_8_ = dVar362 * local_5f8;
          auVar364._8_8_ = dVar373 * local_5f8;
          auVar199 = divpd(auVar364,_DAT_01033a20);
          auVar342._0_8_ = local_5f8 * dVar54;
          auVar342._8_8_ = local_5f8 * dVar361;
          auVar172 = divpd(auVar342,_DAT_01033a30);
          dVar109 = ((((((auVar278._8_8_ + auVar278._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                      auVar199._8_8_) + auVar199._0_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar55 = (double)(~uVar14 & (ulong)(dVar314 * dVar194 * 0.9847450218426964));
        dVar109 = p->cam_beta * dVar109;
        dVar56 = dVar99 * dVar109;
        dVar159 = 0.0;
        if (dVar1 < local_d28) {
          dVar159 = dVar21 * 0.375 * dVar56 + (dVar55 * -0.375 * dVar100 - dVar300);
        }
        pdVar3 = out->vrho;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vrho * sVar10;
          pdVar3[lVar8] = __x * (dVar274 + dVar159) + dVar101 + pdVar3[lVar8];
        }
        dVar195 = 0.0;
        if (dVar19 < dVar205) {
          dVar195 = (double)(~uVar11 & (ulong)(-dVar138 - dVar20 * dVar49));
        }
        dVar57 = dVar195 * __x + dVar57 + 1.0;
        dVar205 = (dVar90 * dVar272 * dVar57) / -6.0;
        local_5e8 = dVar205;
        if (dVar182 <= 1.35) {
          local_5e8 = 0.0;
        }
        dVar31 = -dVar31;
        dVar205 = (double)(~uVar17 & (ulong)dVar205);
        dVar327 = dVar205 * dVar31 * dVar34 + dVar253 * dVar205 + dVar237 * dVar205 * dVar34 * 0.5;
        dVar58 = dVar205 + dVar205;
        dVar315 = dVar92 * dVar327 + dVar183 * dVar58 + dVar238 * dVar205;
        if (dVar182 < 1.35) {
          dVar59 = dVar144 * -2.6666666666666665 * dVar315 + dVar205 * -2.6666666666666665 * dVar32;
        }
        else {
          auVar224._0_8_ = -dVar325 * local_5e8;
          auVar224._8_8_ = dVar298 * local_5e8;
          auVar278 = divpd(auVar224,_DAT_01033a00);
          auVar264._0_8_ = dVar212 * local_5e8;
          auVar264._8_8_ = dVar232 * local_5e8;
          auVar69 = divpd(auVar264,_DAT_01033a10);
          auVar343._0_8_ = dVar299 * local_5e8;
          auVar343._8_8_ = dVar311 * local_5e8;
          auVar199 = divpd(auVar343,_DAT_01033a20);
          auVar318._0_8_ = local_5e8 * dVar156;
          auVar318._8_8_ = local_5e8 * dVar179;
          auVar172 = divpd(auVar318,_DAT_01033a30);
          dVar59 = ((((((auVar278._8_8_ + auVar278._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                     auVar199._8_8_) + auVar199._0_8_) - auVar172._8_8_) + auVar172._0_8_;
        }
        dVar215 = (double)(~uVar13 & (ulong)(dVar106 * dVar195 * 0.9847450218426964));
        dVar59 = dVar59 * p->cam_beta;
        dVar160 = dVar39 * dVar59;
        dVar196 = 0.0;
        if (dVar377 < dVar18) {
          dVar196 = dVar23 * 0.375 * dVar160 + (dVar215 * -0.375 * dVar190 - dVar354);
        }
        dVar354 = 0.0;
        if (bVar5 && bVar4) {
          dVar354 = dVar138 - dVar49 * dVar146;
        }
        dVar216 = pdVar2[1] / (dVar187 * dVar187);
        dVar161 = dVar147 / (local_d28 * dVar95);
        dVar60 = dVar185 / (dVar95 * dVar233);
        dVar259 = dVar94 * -2.6666666666666665 * dVar161 + dVar208 * -5.333333333333333 * dVar60;
        dVar260 = 1.0 / (dVar209 * dVar209);
        dVar61 = dVar259 * dVar149 * dVar216 +
                 dVar260 * dVar188 * -2.6666666666666665 * dVar38 * dVar161;
        dVar88 = (p->cam_omega / dVar150) / dVar88;
        dVar110 = dVar43 * dVar88 * 3.141592653589793;
        dVar162 = dVar189 * dVar189;
        dVar374 = 1.0 / dVar162;
        dVar163 = dVar354 * __x + dVar62 + 1.0;
        dVar217 = dVar50 * dVar110;
        dVar375 = dVar374 * 1.5874010519681996 * dVar217;
        dVar62 = (dVar163 * dVar255) / -6.0 + dVar61 * dVar375 * 0.25;
        dVar138 = 0.0;
        if (dVar151 <= 1.35) {
          dVar138 = dVar62;
        }
        dVar44 = -dVar44;
        dVar62 = (double)((ulong)dVar62 & uVar12);
        dVar164 = dVar138 * dVar44 * dVar47 + dVar213 * dVar138 + dVar257 * dVar138 * dVar47 * 0.5;
        dVar261 = dVar138 + dVar138;
        dVar218 = dVar258 * dVar138 + dVar97 * dVar164 + dVar98 * dVar261;
        if (dVar151 < 1.35) {
          dVar316 = dVar35 * -2.6666666666666665 * dVar218 + dVar138 * -2.6666666666666665 * dVar286
          ;
        }
        else {
          auVar225._0_8_ = -dVar158 * dVar62;
          auVar225._8_8_ = dVar240 * dVar62;
          auVar69 = divpd(auVar225,_DAT_01033a00);
          auVar265._0_8_ = dVar326 * dVar62;
          auVar265._8_8_ = dVar335 * dVar62;
          auVar172 = divpd(auVar265,_DAT_01033a10);
          auVar359._0_8_ = dVar362 * dVar62;
          auVar359._8_8_ = dVar373 * dVar62;
          auVar199 = divpd(auVar359,_DAT_01033a20);
          auVar71._0_8_ = dVar62 * dVar54;
          auVar71._8_8_ = dVar62 * dVar361;
          auVar278 = divpd(auVar71,_DAT_01033a30);
          dVar316 = ((((((auVar69._8_8_ + auVar69._0_8_) - auVar172._8_8_) + auVar172._0_8_) -
                      auVar199._8_8_) + auVar199._0_8_) - auVar278._8_8_) + auVar278._0_8_;
        }
        dVar219 = (double)(~uVar14 & (ulong)(dVar354 * dVar314 * 0.9847450218426964));
        dVar111 = dVar24 * dVar61;
        dVar165 = dVar191 * dVar111;
        dVar316 = p->cam_beta * dVar316;
        dVar275 = dVar99 * dVar316;
        dVar63 = 0.0;
        if (dVar1 < local_d28) {
          dVar63 = dVar21 * 0.375 * dVar275 +
                   ((dVar219 * -0.375 * dVar100 - dVar300) - dVar21 * 0.375 * dVar165);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vrho * sVar10;
          pdVar3[lVar8 + 1] = (dVar196 + dVar63) * __x + dVar101 + pdVar3[lVar8 + 1];
        }
        dVar101 = pdVar2[2];
        dVar300 = pdVar2[3];
        dVar112 = dVar120 * dVar300;
        dVar301 = dVar101 * dVar85 + (dVar112 + dVar112) * dVar140;
        dVar64 = pdVar2[4];
        dVar355 = dVar104 * dVar64;
        dVar85 = dVar85 * dVar355;
        dVar220 = dVar153 * dVar86 * dVar301 + dVar25 * dVar85;
        dVar113 = dVar155 * dVar51;
        dVar114 = dVar113 * dVar220 * 0.25;
        local_438 = dVar114;
        if (dVar182 <= 1.35) {
          local_438 = 0.0;
        }
        dVar114 = (double)(~uVar17 & (ulong)dVar114);
        dVar317 = dVar114 * dVar31 * dVar34 + dVar253 * dVar114 + dVar237 * dVar114 * dVar34 * 0.5;
        dVar166 = dVar114 + dVar114;
        dVar221 = dVar92 * dVar317 + dVar183 * dVar166 + dVar238 * dVar114;
        if (dVar182 < 1.35) {
          dVar116 = dVar114 * -2.6666666666666665 * dVar32;
          dVar167 = dVar144 * -2.6666666666666665 * dVar221;
        }
        else {
          auVar124._0_8_ = dVar156 * local_438;
          auVar124._8_8_ = dVar179 * local_438;
          auVar306._0_8_ = dVar299 * local_438;
          auVar306._8_8_ = dVar311 * local_438;
          auVar266._0_8_ = dVar212 * local_438;
          auVar266._8_8_ = dVar232 * local_438;
          auVar319._0_8_ = -dVar325 * local_438;
          auVar319._8_8_ = dVar298 * local_438;
          auVar199 = divpd(auVar319,_DAT_01033a00);
          auVar69 = divpd(auVar266,_DAT_01033a10);
          auVar172 = divpd(auVar306,_DAT_01033a20);
          auVar278 = divpd(auVar124,_DAT_01033a30);
          dVar116 = auVar278._0_8_;
          dVar167 = (((((auVar199._8_8_ + auVar199._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                     auVar172._8_8_) + auVar172._0_8_) - auVar278._8_8_;
        }
        dVar115 = dVar24 * dVar220;
        dVar276 = dVar40 * dVar115;
        dVar168 = (dVar167 + dVar116) * p->cam_beta;
        dVar197 = dVar39 * dVar168;
        dVar116 = dVar23 * 0.375;
        dVar167 = (double)(~uVar15 & (ulong)(dVar36 * dVar276 + dVar116 * dVar197));
        pdVar3 = out->vsigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vsigma * sVar10;
          dVar101 = (pdVar3 + lVar8)[1];
          pdVar3[lVar8] = __x * dVar167 + pdVar3[lVar8];
          (pdVar3 + lVar8)[1] = dVar101 + 0.0;
          dVar101 = pdVar2[2];
          dVar300 = pdVar2[3];
          dVar64 = pdVar2[4];
        }
        dVar300 = dVar300 * local_bd0;
        dVar338 = dVar101 * dVar148 + (dVar300 + dVar300) * dVar186;
        dVar64 = dVar64 * dVar260;
        dVar148 = dVar148 * dVar64;
        dVar169 = dVar188 * dVar148 + dVar216 * dVar149 * dVar338;
        dVar101 = dVar375 * dVar169 * 0.25;
        local_428 = dVar101;
        if (dVar151 <= 1.35) {
          local_428 = 0.0;
        }
        dVar101 = (double)(~uVar12 & (ulong)dVar101);
        dVar241 = dVar101 * dVar44 * dVar47 + dVar213 * dVar101 + dVar257 * dVar101 * dVar47 * 0.5;
        dVar262 = dVar101 + dVar101;
        dVar328 = dVar97 * dVar241 + dVar98 * dVar262 + dVar258 * dVar101;
        if (dVar151 < 1.35) {
          dVar66 = dVar101 * -2.6666666666666665 * dVar286;
          dVar287 = dVar35 * -2.6666666666666665 * dVar328;
        }
        else {
          auVar125._0_8_ = dVar54 * local_428;
          auVar125._8_8_ = dVar361 * local_428;
          auVar307._0_8_ = dVar362 * local_428;
          auVar307._8_8_ = dVar373 * local_428;
          auVar267._0_8_ = dVar326 * local_428;
          auVar267._8_8_ = dVar335 * local_428;
          auVar320._0_8_ = -dVar158 * local_428;
          auVar320._8_8_ = dVar240 * local_428;
          auVar199 = divpd(auVar320,_DAT_01033a00);
          auVar69 = divpd(auVar267,_DAT_01033a10);
          auVar172 = divpd(auVar307,_DAT_01033a20);
          auVar278 = divpd(auVar125,_DAT_01033a30);
          dVar66 = auVar278._0_8_;
          dVar287 = (((((auVar199._8_8_ + auVar199._0_8_) - auVar69._8_8_) + auVar69._0_8_) -
                     auVar172._8_8_) + auVar172._0_8_) - auVar278._8_8_;
        }
        dVar65 = dVar24 * dVar169;
        dVar170 = dVar191 * dVar65;
        dVar288 = (dVar287 + dVar66) * p->cam_beta;
        dVar66 = dVar99 * dVar288;
        dVar117 = dVar21 * 0.375;
        dVar287 = (double)(~uVar16 & (ulong)(dVar48 * dVar170 + dVar117 * dVar66));
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar8 = (long)(p->dim).vsigma * sVar10;
          pdVar3[lVar8 + 2] = __x * dVar287 + pdVar3[lVar8 + 2];
        }
        dVar171 = 1.0 / (__x * dVar102);
        dVar20 = dVar20 * dVar171;
        dVar20 = dVar20 + dVar20;
        dVar49 = dVar49 + dVar49;
        dVar329 = 0.0;
        if (bVar5 && bVar4) {
          dVar329 = dVar20 - dVar49;
        }
        dVar22 = 1.0 / (dVar22 * dVar22);
        dVar302 = -0.0;
        if (dVar19 < dVar81) {
          dVar302 = (dVar106 * dVar329 + dVar22 * 0.4444444444444444 * dVar324 * dVar324) *
                    0.9847450218426964 * -0.375;
        }
        dVar289 = (dVar139 / dVar206) / (dVar18 * dVar83);
        dVar242 = ((pdVar2[1] / (dVar141 * dVar141)) / dVar141) * -2.0;
        dVar83 = dVar120 * dVar355 * dVar271;
        dVar141 = dVar25 * (dVar104 / dVar143);
        dVar139 = pdVar2[4] * pdVar2[4];
        dVar356 = dVar142 * dVar104 * dVar25 * 9.777777777777779 * (dVar84 / dVar206) +
                  dVar141 * -14.222222222222221 * dVar120 * dVar120 * dVar139 * dVar289 +
                  dVar235 * dVar153 * -5.333333333333333 * dVar83 +
                  dVar235 * dVar235 * dVar86 * dVar242 +
                  (dVar82 * 9.777777777777779 * (dVar84 / dVar206) +
                  dVar181 * 33.77777777777778 * dVar289) * dVar153 * dVar86;
        dVar181 = 1.0 / (dVar27 * dVar27);
        dVar82 = dVar181 * 2.519842099789747;
        dVar181 = dVar181 * 1.4422495703074083;
        dVar84 = 1.0 / (dVar296 * dVar296);
        dVar339 = 1.0 / (dVar26 * dVar296);
        dVar142 = dVar84 * 2.519842099789747;
        dVar296 = dVar272 * dVar89 * 3.141592653589793;
        dVar50 = dVar50 * 1.5874010519681996;
        dVar30 = dVar30 * (((((p->cam_omega / dVar28) / 14.234432706575232) / dVar82) / dVar154) /
                          3.0) * 9.869604401089358 * 1.125;
        dVar206 = dVar181 * dVar30;
        dVar28 = dVar339 * 1.5874010519681996;
        dVar289 = (dVar29 / (dVar81 * dVar81)) / dVar102;
        dVar303 = dVar289 * 1.2599210498948732;
        dVar27 = ((dVar329 * __x + dVar324 + dVar324) * dVar90 * dVar272) / -6.0 +
                 dVar90 * 0.2222222222222222 * dVar303 * dVar297 * dVar297 +
                 dVar155 * dVar356 * dVar51 * 0.25 +
                 dVar236 * dVar236 * dVar28 * dVar51 * -0.5 +
                 dVar142 * dVar236 * dVar236 * dVar206 +
                 (dVar154 * dVar236 * dVar50 * dVar297 * dVar296) / -6.0;
        dVar312 = dVar270 / dVar312;
        dVar376 = 1.0 / (dVar91 * dVar91);
        dVar91 = dVar376 / dVar91;
        dVar329 = ((dVar352 / __x) * dVar26 * dVar40 * dVar23) / 12.0;
        dVar29 = dVar376 * -2.0;
        dVar26 = dVar34 * dVar237 + dVar34 * dVar237;
        local_548 = auVar304._0_8_;
        dStack_540 = auVar304._8_8_;
        if (dVar182 < 1.35) {
          dVar27 = (double)(~uVar17 & (ulong)dVar27);
          dVar67 = dVar68 * dVar68;
          dVar27 = dVar144 * -2.6666666666666665 *
                   ((dVar27 * dVar31 * dVar34 +
                    dVar253 * dVar27 +
                    ((dVar67 * -4.0 * dVar145 +
                     dVar91 * dVar67 * dVar34 * 0.25 +
                     dVar29 * dVar67 * dVar34 + dVar237 * dVar27 * dVar34 * 0.5) -
                    dVar67 * dVar33 * dVar34)) * dVar92 +
                   dVar68 * 4.0 * dVar254 +
                   (dVar27 + dVar27) * dVar183 +
                   dVar238 * dVar27 +
                   (dVar26 * dVar67 - dVar67 * (dVar376 / dVar144) * dVar34 * 0.5)) +
                   dVar27 * -2.6666666666666665 * dVar32 + dVar68 * -5.333333333333333 * dVar239;
        }
        else {
          dVar67 = dVar211 * dVar211;
          dVar27 = (double)((ulong)dVar27 & uVar17);
          auVar321._0_8_ = dVar285 * dVar67;
          auVar321._8_8_ = dVar232 * dVar27;
          auVar69 = divpd(auVar321,_DAT_01033a40);
          auVar344._0_8_ = dVar212 * dVar27;
          auVar344._8_8_ = local_548 * dVar67;
          auVar172 = divpd(auVar344,_DAT_01033a50);
          auVar365._0_8_ = dStack_540 * dVar67;
          auVar365._8_8_ = dVar311 * dVar27;
          auVar199 = divpd(auVar365,_DAT_01033a60);
          auVar378._0_8_ = dVar299 * dVar27;
          auVar378._8_8_ = dVar207 * dVar67;
          auVar173 = divpd(auVar378,_DAT_01033a70);
          auVar126._0_8_ = dVar67 * dVar270;
          auVar126._8_8_ = dVar27 * dVar179;
          auVar304 = divpd(auVar126,_DAT_01033a80);
          auVar175._0_8_ = dVar156 * dVar27;
          auVar175._8_8_ = dVar312 * dVar67;
          auVar278 = divpd(auVar175,_DAT_01033a90);
          dVar27 = ((((((((((dVar27 * dVar298) / 240.0 +
                            (dVar252 * dVar67) / -48.0 +
                            (dVar325 * dVar27) / -18.0 + (dVar184 * dVar67) / 6.0 + auVar69._0_8_) -
                          auVar69._8_8_) - auVar172._8_8_) + auVar172._0_8_ + auVar199._0_8_) -
                       auVar199._8_8_) - auVar173._8_8_) + auVar173._0_8_ + auVar304._0_8_) -
                    auVar304._8_8_) - auVar278._8_8_) + auVar278._0_8_;
        }
        dVar357 = dVar23 * dVar313 * dVar353;
        dVar360 = dVar23 * dVar352 * dVar236 * dVar40;
        dVar67 = 0.0;
        dVar222 = 0.0;
        if (dVar377 < dVar18) {
          dVar222 = dVar27 * p->cam_beta * dVar39 * dVar116 +
                    dVar23 * 0.75 * dVar107 * dVar313 +
                    ((((dVar192 * 0.75 * dVar108 +
                        ((dVar302 * dVar190 + dVar192 * dVar323 * -0.25) - dVar192 * 0.75 * dVar193)
                       + dVar329) - dVar360 * 0.25) + dVar357 * 0.25) -
                    dVar356 * dVar24 * dVar40 * dVar116);
        }
        dVar171 = dVar171 * dVar146;
        dVar171 = dVar171 + dVar171;
        if (bVar5 && bVar4) {
          dVar67 = dVar49 + dVar171;
        }
        dVar27 = 1.0 / (dVar37 * dVar37);
        dVar37 = -0.0;
        if (dVar180 < dVar93) {
          dVar37 = (dVar67 * dVar314 + dVar27 * 0.4444444444444444 * dVar194 * dVar194) *
                   0.9847450218426964 * -0.375;
        }
        dVar146 = ((dVar352 / __x) * dVar189 * dVar191 * dVar21) / 12.0;
        dVar102 = (dVar42 / (dVar93 * dVar93)) / dVar102;
        dVar42 = dVar41 * 0.2222222222222222 * dVar102 * 1.2599210498948732;
        dVar302 = dVar157 * dVar157 * dVar42 + ((dVar67 * __x + dVar194 + dVar194) * dVar255) / -6.0
        ;
        dVar351 = dVar234 / dVar351;
        dVar356 = 1.0 / (dVar96 * dVar96);
        dVar96 = dVar356 / dVar96;
        dVar67 = dVar356 * -2.0;
        dVar363 = dVar47 * dVar257 + dVar47 * dVar257;
        local_538 = auVar121._0_8_;
        dStack_530 = auVar121._8_8_;
        if (dVar151 < 1.35) {
          dVar302 = (double)(~uVar12 & (ulong)dVar302);
          dVar277 = dVar256 * dVar256;
          dVar302 = dVar35 * -2.6666666666666665 *
                    ((dVar302 * dVar44 * dVar47 +
                     dVar213 * dVar302 +
                     ((dVar277 * -4.0 * dVar152 +
                      dVar96 * dVar277 * dVar47 * 0.25 +
                      dVar67 * dVar277 * dVar47 + dVar257 * dVar302 * dVar47 * 0.5) -
                     dVar277 * dVar46 * dVar47)) * dVar97 +
                    dVar256 * 4.0 * dVar336 +
                    (dVar302 + dVar302) * dVar98 +
                    dVar258 * dVar302 +
                    (dVar363 * dVar277 - dVar277 * (dVar356 / dVar35) * dVar47 * 0.5)) +
                    dVar302 * -2.6666666666666665 * dVar286 + dVar256 * -5.333333333333333 * dVar337
          ;
        }
        else {
          dVar277 = local_5f8 * local_5f8;
          dVar302 = (double)((ulong)dVar302 & uVar12);
          auVar176._0_8_ = dVar250 * dVar277;
          auVar176._8_8_ = dVar335 * dVar302;
          auVar278 = divpd(auVar176,_DAT_01033a40);
          auVar334._0_8_ = dVar326 * dVar302;
          auVar334._8_8_ = local_538 * dVar277;
          auVar199 = divpd(auVar334,_DAT_01033a50);
          auVar72._0_8_ = dStack_530 * dVar277;
          auVar72._8_8_ = dVar373 * dVar302;
          auVar304 = divpd(auVar72,_DAT_01033a60);
          auVar280._0_8_ = dVar362 * dVar302;
          auVar280._8_8_ = dVar295 * dVar277;
          auVar172 = divpd(auVar280,_DAT_01033a70);
          auVar243._0_8_ = dVar277 * dVar234;
          auVar243._8_8_ = dVar302 * dVar361;
          auVar69 = divpd(auVar243,_DAT_01033a80);
          auVar244._0_8_ = dVar54 * dVar302;
          auVar244._8_8_ = dVar351 * dVar277;
          auVar121 = divpd(auVar244,_DAT_01033a90);
          dVar302 = ((((((((((dVar302 * dVar240) / 240.0 +
                             (dVar210 * dVar277) / -48.0 +
                             (dVar158 * dVar302) / -18.0 + (dVar45 * dVar277) / 6.0 + auVar278._0_8_
                            ) - auVar278._8_8_) - auVar199._8_8_) + auVar199._0_8_ + auVar304._0_8_)
                        - auVar304._8_8_) - auVar172._8_8_) + auVar172._0_8_ + auVar69._0_8_) -
                     auVar69._8_8_) - auVar121._8_8_) + auVar121._0_8_;
        }
        dVar198 = dVar251 * dVar109 * dVar21;
        dVar277 = 0.0;
        if (dVar1 < local_d28) {
          dVar277 = dVar302 * p->cam_beta * dVar99 * dVar117 +
                    dVar198 * 0.25 +
                    dVar55 * 0.75 * dVar56 + dVar37 * dVar100 + dVar52 * dVar55 * -0.25 + dVar146;
        }
        pdVar3 = out->v2rho2;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rho2 * sVar10;
          pdVar3[lVar8] =
               (dVar222 + dVar277) * __x + dVar274 + dVar274 + dVar159 + dVar159 + pdVar3[lVar8];
        }
        dVar37 = 0.0;
        if (bVar5 && bVar4) {
          dVar37 = dVar20;
        }
        dVar302 = -0.0;
        if (dVar19 < dVar81) {
          dVar302 = (dVar22 * dVar195 * 0.4444444444444444 * dVar324 + dVar106 * dVar37) *
                    0.9847450218426964 * -0.375;
        }
        dVar87 = ((dVar37 * __x + dVar324 + dVar195) * dVar272 * dVar90) / -6.0 +
                 dVar90 * 1.2599210498948732 * 0.2222222222222222 * dVar289 * dVar57 * dVar297 +
                 (dVar272 * dVar57 * dVar89 * dVar87 * -6.534776057350833 * dVar155 * dVar236) /
                 12.0;
        dVar155 = dVar34 * dVar205;
        dVar324 = dVar34 * dVar68;
        dVar37 = dVar145 * dVar68 * -4.0;
        dVar33 = -dVar33;
        dVar89 = -(dVar376 / dVar144);
        if (dVar182 < 1.35) {
          dVar87 = (double)(~uVar17 & (ulong)dVar87);
          dVar87 = dVar205 * -2.6666666666666665 * dVar239 +
                   dVar68 * -2.6666666666666665 * dVar315 +
                   dVar87 * -2.6666666666666665 * dVar32 +
                   dVar144 * -2.6666666666666665 *
                   ((dVar87 * dVar31 * dVar34 +
                    dVar253 * dVar87 +
                    dVar68 * dVar33 * dVar155 +
                    dVar37 * dVar205 +
                    dVar91 * dVar205 * dVar324 * 0.25 +
                    dVar376 * dVar205 * -2.0 * dVar324 + dVar237 * dVar87 * dVar34 * 0.5) * dVar92 +
                   dVar273 * dVar327 +
                   dVar58 * dVar254 +
                   (dVar87 + dVar87) * dVar183 +
                   dVar238 * dVar87 + dVar68 * dVar205 * dVar26 + dVar68 * dVar89 * dVar155 * 0.5);
        }
        else {
          dVar87 = (double)((ulong)dVar87 & uVar17);
          auVar127._0_8_ = dVar285 * local_5e8 * dVar211;
          auVar127._8_8_ = dVar87 * dVar232;
          auVar304 = divpd(auVar127,_DAT_01033a40);
          auVar202._0_8_ = dVar87 * dVar212;
          auVar202._8_8_ = local_548 * local_5e8 * dVar211;
          auVar121 = divpd(auVar202,_DAT_01033a50);
          auVar128._0_8_ = dStack_540 * local_5e8 * dVar211;
          auVar128._8_8_ = dVar87 * dVar311;
          auVar278 = divpd(auVar128,_DAT_01033a60);
          auVar203._0_8_ = dVar87 * dVar299;
          auVar203._8_8_ = dVar207 * local_5e8 * dVar211;
          auVar172 = divpd(auVar203,_DAT_01033a70);
          auVar129._0_8_ = dVar270 * local_5e8 * dVar211;
          auVar129._8_8_ = dVar87 * dVar179;
          auVar69 = divpd(auVar129,_DAT_01033a80);
          auVar226._0_8_ = dVar87 * dVar156;
          auVar226._8_8_ = dVar312 * local_5e8 * dVar211;
          auVar199 = divpd(auVar226,_DAT_01033a90);
          dVar87 = ((((((((((dVar87 * dVar298) / 240.0 +
                            (dVar252 * local_5e8 * dVar211) / -48.0 +
                            (dVar325 * dVar87) / -18.0 + (dVar184 * local_5e8 * dVar211) / 6.0 +
                           auVar304._0_8_) - auVar304._8_8_) - auVar121._8_8_) + auVar121._0_8_ +
                        auVar278._0_8_) - auVar278._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                     auVar69._0_8_) - auVar69._8_8_) - auVar199._8_8_) + auVar199._0_8_;
        }
        dVar289 = 0.0;
        if (bVar5 && bVar4) {
          dVar289 = dVar171;
        }
        dVar222 = -0.0;
        if (dVar180 < dVar93) {
          dVar222 = (dVar354 * dVar27 * 0.4444444444444444 * dVar194 + dVar289 * dVar314) *
                    0.9847450218426964 * -0.375;
        }
        dVar88 = dVar53 * dVar88 * 3.141592653589793 * dVar50;
        dVar53 = dVar374 * dVar61 * dVar88;
        dVar41 = ((dVar289 * __x + dVar194 + dVar354) * dVar255) / -6.0 +
                 dVar41 * 1.2599210498948732 * 0.2222222222222222 * dVar102 * dVar163 * dVar157 +
                 (dVar157 * dVar53) / -12.0;
        dVar102 = dVar47 * dVar138;
        dVar194 = dVar47 * dVar256;
        dVar289 = dVar152 * dVar256 * -4.0;
        dVar46 = -dVar46;
        dVar277 = -(dVar356 / dVar35);
        if (dVar151 < 1.35) {
          dVar41 = (double)(~uVar12 & (ulong)dVar41);
          dVar41 = dVar138 * -2.6666666666666665 * dVar337 +
                   dVar256 * -2.6666666666666665 * dVar218 +
                   dVar41 * -2.6666666666666665 * dVar286 +
                   dVar35 * -2.6666666666666665 *
                   ((dVar41 * dVar44 * dVar47 +
                    dVar213 * dVar41 +
                    dVar256 * dVar46 * dVar102 +
                    dVar289 * dVar138 +
                    dVar96 * dVar138 * dVar194 * 0.25 +
                    dVar356 * dVar138 * -2.0 * dVar194 + dVar257 * dVar41 * dVar47 * 0.5) * dVar97 +
                   dVar214 * dVar164 +
                   dVar261 * dVar336 +
                   (dVar41 + dVar41) * dVar98 +
                   dVar258 * dVar41 +
                   dVar256 * dVar138 * dVar363 + dVar256 * dVar277 * dVar102 * 0.5);
        }
        else {
          dVar41 = (double)((ulong)dVar41 & uVar12);
          auVar130._0_8_ = dVar250 * dVar62 * local_5f8;
          auVar130._8_8_ = dVar41 * dVar335;
          auVar304 = divpd(auVar130,_DAT_01033a40);
          auVar366._0_8_ = dVar41 * dVar326;
          auVar366._8_8_ = local_538 * dVar62 * local_5f8;
          auVar172 = divpd(auVar366,_DAT_01033a50);
          auVar131._0_8_ = dStack_530 * dVar62 * local_5f8;
          auVar131._8_8_ = dVar41 * dVar373;
          auVar278 = divpd(auVar131,_DAT_01033a60);
          auVar367._0_8_ = dVar41 * dVar362;
          auVar367._8_8_ = dVar295 * dVar62 * local_5f8;
          auVar199 = divpd(auVar367,_DAT_01033a70);
          auVar132._0_8_ = dVar234 * dVar62 * local_5f8;
          auVar132._8_8_ = dVar41 * dVar361;
          auVar69 = divpd(auVar132,_DAT_01033a80);
          auVar345._0_8_ = dVar41 * dVar54;
          auVar345._8_8_ = dVar351 * dVar62 * local_5f8;
          auVar121 = divpd(auVar345,_DAT_01033a90);
          dVar41 = ((((((((((dVar41 * dVar240) / 240.0 +
                            (dVar210 * dVar62 * local_5f8) / -48.0 +
                            (dVar158 * dVar41) / -18.0 + (dVar45 * dVar62 * local_5f8) / 6.0 +
                           auVar304._0_8_) - auVar304._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                        auVar278._0_8_) - auVar278._8_8_) - auVar199._8_8_) + auVar199._0_8_ +
                     auVar69._0_8_) - auVar69._8_8_) - auVar121._8_8_) + auVar121._0_8_;
        }
        dVar358 = dVar215 * 0.375;
        dVar118 = dVar353 * dVar59 * dVar23;
        dVar340 = dVar21 * dVar316 * dVar251;
        dVar350 = dVar21 * dVar352 * dVar61 * dVar191;
        dVar119 = dVar55 * 0.375;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rho2 * sVar10;
          pdVar3[lVar8 + 1] =
               ((double)(~uVar16 &
                        (ulong)(dVar41 * p->cam_beta * dVar99 * dVar117 +
                               dVar340 * 0.125 +
                               dVar119 * dVar275 +
                               dVar109 * dVar111 * dVar117 +
                               dVar350 * -0.125 +
                               ((dVar198 * 0.125 +
                                dVar52 * dVar55 * -0.125 +
                                dVar56 * dVar219 * 0.375 +
                                dVar222 * dVar100 + dVar52 * dVar219 * -0.125 + dVar146) -
                               dVar119 * dVar165))) +
               (double)(~uVar15 &
                       (ulong)(dVar87 * p->cam_beta * dVar39 * dVar116 +
                              dVar107 * dVar59 * dVar116 +
                              dVar118 * 0.125 +
                              dVar192 * 0.375 * dVar160 +
                              dVar357 * 0.125 +
                              dVar360 * -0.125 +
                              dVar192 * dVar323 * -0.125 +
                              dVar108 * dVar358 +
                              ((dVar302 * dVar190 + dVar323 * dVar215 * -0.125) - dVar193 * dVar358)
                              + dVar329))) * __x + dVar274 + dVar159 + dVar196 + dVar63 +
               pdVar3[lVar8 + 1];
        }
        dVar87 = 0.0;
        if (bVar5 && bVar4) {
          dVar87 = dVar20 + dVar49;
        }
        dVar20 = -0.0;
        if (dVar19 < dVar81) {
          dVar20 = (dVar106 * dVar87 + dVar22 * 0.4444444444444444 * dVar195 * dVar195) *
                   0.9847450218426964 * -0.375;
        }
        dVar19 = dVar90 * 0.2222222222222222 * dVar303 * dVar57 * dVar57 +
                 (dVar90 * dVar272 * (dVar87 * __x + dVar195 + dVar195)) / -6.0;
        if (dVar182 < 1.35) {
          dVar19 = (double)(~uVar17 & (ulong)dVar19);
          dVar22 = dVar205 * dVar205;
          dVar81 = dVar19 * -2.6666666666666665 * dVar32 + dVar205 * -5.333333333333333 * dVar315;
          dVar19 = dVar144 * -2.6666666666666665 *
                   ((dVar19 * dVar31 * dVar34 +
                    dVar253 * dVar19 +
                    dVar22 * dVar33 * dVar34 +
                    dVar22 * -4.0 * dVar145 +
                    dVar91 * dVar22 * dVar34 * 0.25 +
                    dVar29 * dVar22 * dVar34 + dVar237 * dVar19 * dVar34 * 0.5) * dVar92 +
                   dVar205 * 4.0 * dVar327 +
                   (dVar19 + dVar19) * dVar183 +
                   dVar238 * dVar19 + dVar22 * dVar89 * dVar34 * 0.5 + dVar26 * dVar22);
        }
        else {
          dVar22 = local_5e8 * local_5e8;
          dVar19 = (double)((ulong)dVar19 & uVar17);
          auVar292._0_8_ = dVar285 * dVar22;
          auVar292._8_8_ = dVar232 * dVar19;
          auVar199 = divpd(auVar292,_DAT_01033a40);
          auVar281._0_8_ = dVar212 * dVar19;
          auVar281._8_8_ = local_548 * dVar22;
          auVar69 = divpd(auVar281,_DAT_01033a50);
          auVar282._0_8_ = dStack_540 * dVar22;
          auVar282._8_8_ = dVar311 * dVar19;
          auVar121 = divpd(auVar282,_DAT_01033a60);
          auVar283._0_8_ = dVar299 * dVar19;
          auVar283._8_8_ = dVar207 * dVar22;
          auVar172 = divpd(auVar283,_DAT_01033a70);
          auVar245._0_8_ = dVar22 * dVar270;
          auVar245._8_8_ = dVar19 * dVar179;
          auVar304 = divpd(auVar245,_DAT_01033a80);
          auVar246._0_8_ = dVar156 * dVar19;
          auVar246._8_8_ = dVar312 * dVar22;
          auVar278 = divpd(auVar246,_DAT_01033a90);
          dVar81 = auVar278._0_8_;
          dVar19 = (((((((((dVar19 * dVar298) / 240.0 +
                           (dVar252 * dVar22) / -48.0 +
                           (dVar325 * dVar19) / -18.0 + (dVar184 * dVar22) / 6.0 + auVar199._0_8_) -
                         auVar199._8_8_) - auVar69._8_8_) + auVar69._0_8_ + auVar121._0_8_) -
                      auVar121._8_8_) - auVar172._8_8_) + auVar172._0_8_ + auVar304._0_8_) -
                   auVar304._8_8_) - auVar278._8_8_;
        }
        dVar87 = 0.0;
        dVar22 = 0.0;
        if (dVar377 < dVar18) {
          dVar22 = (dVar19 + dVar81) * p->cam_beta * dVar39 * dVar116 +
                   dVar118 * 0.25 +
                   dVar329 + dVar215 * 0.75 * dVar160 + dVar20 * dVar190 + dVar323 * dVar215 * -0.25
          ;
        }
        if (bVar5 && bVar4) {
          dVar87 = dVar171 - dVar49;
        }
        dVar19 = -0.0;
        if (dVar180 < dVar93) {
          dVar19 = (dVar314 * dVar87 + dVar27 * 0.4444444444444444 * dVar354 * dVar354) *
                   0.9847450218426964 * -0.375;
        }
        dVar20 = (dVar185 / dVar233) / (local_d28 * dVar95);
        dVar41 = ((pdVar2[1] / (dVar187 * dVar187)) / dVar187) * -2.0;
        dVar27 = local_bd0 * dVar64 * dVar161;
        dVar81 = dVar188 * (dVar260 / dVar209);
        dVar323 = dVar38 * dVar260 * dVar188 * 9.777777777777779 * (dVar147 / dVar233) +
                  dVar81 * -14.222222222222221 * local_bd0 * local_bd0 * dVar139 * dVar20 +
                  dVar259 * dVar216 * -5.333333333333333 * dVar27 +
                  dVar259 * dVar259 * dVar149 * dVar41 +
                  (dVar94 * 9.777777777777779 * (dVar147 / dVar233) +
                  dVar208 * 33.77777777777778 * dVar20) * dVar216 * dVar149;
        dVar180 = 1.0 / (dVar162 * dVar162);
        dVar90 = 1.0 / (dVar189 * dVar162);
        dVar20 = dVar43 * (((((p->cam_omega / dVar150) / 14.234432706575232) / dVar82) / dVar374) /
                          3.0) * 9.869604401089358 * 1.125;
        dVar38 = dVar181 * dVar20 * dVar180 * 2.519842099789747;
        dVar217 = dVar90 * 1.5874010519681996 * dVar217;
        dVar82 = ((dVar87 * __x + dVar354 + dVar354) * dVar255) / -6.0 +
                 dVar42 * dVar163 * dVar163 +
                 dVar375 * dVar323 * 0.25 +
                 dVar61 * dVar61 * dVar217 * -0.5 +
                 dVar38 * dVar61 * dVar61 + (dVar53 * dVar163) / -6.0;
        if (dVar151 < 1.35) {
          dVar82 = (double)(~uVar12 & (ulong)dVar82);
          dVar93 = dVar138 * dVar138;
          dVar87 = dVar82 * -2.6666666666666665 * dVar286 + dVar138 * -5.333333333333333 * dVar218;
          dVar82 = dVar35 * -2.6666666666666665 *
                   ((dVar82 * dVar44 * dVar47 +
                    dVar213 * dVar82 +
                    dVar93 * dVar46 * dVar47 +
                    dVar93 * -4.0 * dVar152 +
                    dVar96 * dVar93 * dVar47 * 0.25 +
                    dVar67 * dVar93 * dVar47 + dVar257 * dVar82 * dVar47 * 0.5) * dVar97 +
                   dVar138 * 4.0 * dVar164 +
                   (dVar82 + dVar82) * dVar98 +
                   dVar258 * dVar82 + dVar93 * dVar277 * dVar47 * 0.5 + dVar363 * dVar93);
        }
        else {
          dVar93 = dVar62 * dVar62;
          dVar82 = (double)((ulong)dVar82 & uVar12);
          auVar308._0_8_ = dVar250 * dVar93;
          auVar308._8_8_ = dVar335 * dVar82;
          auVar199 = divpd(auVar308,_DAT_01033a40);
          auVar227._0_8_ = dVar326 * dVar82;
          auVar227._8_8_ = local_538 * dVar93;
          auVar69 = divpd(auVar227,_DAT_01033a50);
          auVar228._0_8_ = dStack_530 * dVar93;
          auVar228._8_8_ = dVar373 * dVar82;
          auVar121 = divpd(auVar228,_DAT_01033a60);
          auVar229._0_8_ = dVar362 * dVar82;
          auVar229._8_8_ = dVar295 * dVar93;
          auVar172 = divpd(auVar229,_DAT_01033a70);
          auVar133._0_8_ = dVar93 * dVar234;
          auVar133._8_8_ = dVar82 * dVar361;
          auVar304 = divpd(auVar133,_DAT_01033a80);
          auVar134._0_8_ = dVar54 * dVar82;
          auVar134._8_8_ = dVar351 * dVar93;
          auVar278 = divpd(auVar134,_DAT_01033a90);
          dVar87 = auVar278._0_8_;
          dVar82 = (((((((((dVar82 * dVar240) / 240.0 +
                           (dVar210 * dVar93) / -48.0 +
                           (dVar158 * dVar82) / -18.0 + (dVar45 * dVar93) / 6.0 + auVar199._0_8_) -
                         auVar199._8_8_) - auVar69._8_8_) + auVar69._0_8_ + auVar121._0_8_) -
                      auVar121._8_8_) - auVar172._8_8_) + auVar172._0_8_ + auVar304._0_8_) -
                   auVar304._8_8_) - auVar278._8_8_;
        }
        dVar93 = 0.0;
        if (dVar1 < local_d28) {
          dVar93 = (dVar82 + dVar87) * p->cam_beta * dVar99 * dVar117 +
                   dVar21 * 0.75 * dVar111 * dVar316 +
                   ((((dVar146 +
                      dVar219 * 0.75 * dVar275 +
                      ((dVar19 * dVar100 + dVar52 * dVar219 * -0.25) - dVar165 * dVar219 * 0.75)) -
                     dVar350 * 0.25) + dVar340 * 0.25) - dVar323 * dVar24 * dVar191 * dVar117);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rho2 * sVar10;
          pdVar3[lVar8 + 2] =
               (dVar22 + dVar93) * __x + dVar196 + dVar196 + dVar63 + dVar63 + pdVar3[lVar8 + 2];
        }
        dVar19 = dVar153 * dVar301;
        dVar22 = dVar25 * -2.6666666666666665 * dVar355 * dVar271 +
                 dVar141 * 5.333333333333333 * dVar103 * dVar139 * dVar120 +
                 dVar235 * dVar153 * dVar85 +
                 dVar19 * -2.6666666666666665 * dVar83 +
                 dVar86 * dVar301 * dVar242 * dVar235 +
                 (pdVar2[2] * -2.6666666666666665 * dVar271 +
                 dVar112 * -10.666666666666666 * dVar103) * dVar86 * dVar153;
        dVar82 = dVar296 * dVar50 * dVar154 * dVar220;
        dVar120 = dVar113 * dVar22 * 0.25 +
                  dVar105 * dVar50 * dVar339 * dVar220 * dVar236 * -0.5 +
                  dVar30 * dVar181 * 2.519842099789747 * dVar84 * dVar220 * dVar236 +
                  (dVar297 * dVar82) / -12.0;
        dVar84 = dVar34 * dVar114;
        dVar83 = dVar376 * dVar114 * -2.0;
        if (dVar182 < 1.35) {
          dVar120 = (double)(~uVar17 & (ulong)dVar120);
          dVar120 = dVar114 * -2.6666666666666665 * dVar239 +
                    dVar68 * -2.6666666666666665 * dVar221 +
                    dVar120 * -2.6666666666666665 * dVar32 +
                    dVar144 * -2.6666666666666665 *
                    ((dVar120 * dVar31 * dVar34 +
                     dVar253 * dVar120 +
                     dVar68 * dVar33 * dVar84 +
                     dVar37 * dVar114 +
                     dVar324 * dVar91 * dVar114 * 0.25 +
                     dVar83 * dVar324 + dVar237 * dVar120 * dVar34 * 0.5) * dVar92 +
                    dVar273 * dVar317 +
                    dVar254 * dVar166 +
                    (dVar120 + dVar120) * dVar183 +
                    dVar238 * dVar120 + dVar68 * dVar114 * dVar26 + dVar68 * dVar89 * dVar84 * 0.5);
        }
        else {
          dVar120 = (double)((ulong)dVar120 & uVar17);
          auVar309._0_8_ = dVar285 * local_438 * dVar211;
          auVar309._8_8_ = dVar120 * dVar232;
          auVar278 = divpd(auVar309,_DAT_01033a40);
          auVar346._0_8_ = dVar120 * dVar212;
          auVar346._8_8_ = local_548 * local_438 * dVar211;
          auVar69 = divpd(auVar346,_DAT_01033a50);
          auVar347._0_8_ = dStack_540 * local_438 * dVar211;
          auVar347._8_8_ = dVar120 * dVar311;
          auVar121 = divpd(auVar347,_DAT_01033a60);
          auVar348._0_8_ = dVar120 * dVar299;
          auVar348._8_8_ = dVar207 * local_438 * dVar211;
          auVar172 = divpd(auVar348,_DAT_01033a70);
          auVar349._0_8_ = dVar270 * local_438 * dVar211;
          auVar349._8_8_ = dVar120 * dVar179;
          auVar199 = divpd(auVar349,_DAT_01033a80);
          auVar135._0_8_ = dVar120 * dVar156;
          auVar135._8_8_ = dVar312 * local_438 * dVar211;
          auVar304 = divpd(auVar135,_DAT_01033a90);
          dVar120 = ((((((((((dVar120 * dVar298) / 240.0 +
                             (dVar211 * dVar252 * local_438) / -48.0 +
                             (dVar325 * dVar120) / -18.0 + (dVar211 * dVar184 * local_438) / 6.0 +
                            auVar278._0_8_) - auVar278._8_8_) - auVar69._8_8_) + auVar69._0_8_ +
                         auVar121._0_8_) - auVar121._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                      auVar199._0_8_) - auVar199._8_8_) - auVar304._8_8_) + auVar304._0_8_;
        }
        dVar141 = dVar352 * dVar220 * dVar40 * dVar23 * 0.125;
        dVar30 = dVar353 * dVar168 * dVar23 * 0.125;
        dVar87 = 0.0;
        if (dVar377 < dVar18) {
          dVar87 = dVar120 * p->cam_beta * dVar39 * dVar116 +
                   dVar107 * dVar168 * dVar116 +
                   dVar192 * 0.375 * dVar197 +
                   dVar313 * dVar115 * dVar116 +
                   ((dVar192 * -0.375 * dVar276 - dVar141) - dVar22 * dVar24 * dVar40 * dVar116) +
                   dVar30;
        }
        pdVar3 = out->v2rhosigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          dVar120 = (pdVar3 + lVar8)[1];
          pdVar3[lVar8] = dVar87 * __x + dVar167 + pdVar3[lVar8];
          (pdVar3 + lVar8)[1] = dVar120 + 0.0;
        }
        dVar88 = dVar88 * dVar374 * dVar169;
        dVar22 = (dVar157 * dVar88) / -12.0;
        dVar120 = dVar47 * dVar101;
        dVar87 = dVar356 * dVar101 * -2.0;
        if (dVar151 < 1.35) {
          dVar22 = (double)(~uVar12 & (ulong)dVar22);
          dVar22 = dVar101 * -2.6666666666666665 * dVar337 +
                   dVar256 * -2.6666666666666665 * dVar328 +
                   dVar22 * -2.6666666666666665 * dVar286 +
                   dVar35 * -2.6666666666666665 *
                   ((dVar22 * dVar44 * dVar47 +
                    dVar213 * dVar22 +
                    dVar256 * dVar46 * dVar120 +
                    dVar289 * dVar101 +
                    dVar194 * dVar96 * dVar101 * 0.25 +
                    dVar87 * dVar194 + dVar257 * dVar22 * dVar47 * 0.5) * dVar97 +
                   dVar214 * dVar241 +
                   dVar336 * dVar262 +
                   (dVar22 + dVar22) * dVar98 +
                   dVar258 * dVar22 +
                   dVar256 * dVar101 * dVar363 + dVar256 * dVar277 * dVar120 * 0.5);
        }
        else {
          dVar22 = (double)((ulong)dVar22 & uVar12);
          auVar293._0_8_ = dVar250 * local_428 * local_5f8;
          auVar293._8_8_ = dVar22 * dVar335;
          auVar69 = divpd(auVar293,_DAT_01033a40);
          auVar368._0_8_ = dVar22 * dVar326;
          auVar368._8_8_ = local_538 * local_428 * local_5f8;
          auVar121 = divpd(auVar368,_DAT_01033a50);
          auVar369._0_8_ = dStack_530 * local_428 * local_5f8;
          auVar369._8_8_ = dVar22 * dVar373;
          auVar172 = divpd(auVar369,_DAT_01033a60);
          auVar370._0_8_ = dVar22 * dVar362;
          auVar370._8_8_ = dVar295 * local_428 * local_5f8;
          auVar199 = divpd(auVar370,_DAT_01033a70);
          auVar73._0_8_ = dVar234 * local_428 * local_5f8;
          auVar73._8_8_ = dVar22 * dVar361;
          auVar304 = divpd(auVar73,_DAT_01033a80);
          auVar268._0_8_ = dVar22 * dVar54;
          auVar268._8_8_ = dVar351 * local_428 * local_5f8;
          auVar278 = divpd(auVar268,_DAT_01033a90);
          dVar22 = ((((((((((dVar22 * dVar240) / 240.0 +
                            (local_5f8 * dVar210 * local_428) / -48.0 +
                            (dVar158 * dVar22) / -18.0 + (local_5f8 * dVar45 * local_428) / 6.0 +
                           auVar69._0_8_) - auVar69._8_8_) - auVar121._8_8_) + auVar121._0_8_ +
                        auVar172._0_8_) - auVar172._8_8_) - auVar199._8_8_) + auVar199._0_8_ +
                     auVar304._0_8_) - auVar304._8_8_) - auVar278._8_8_) + auVar278._0_8_;
        }
        dVar68 = dVar352 * dVar169 * dVar191 * dVar21 * 0.125;
        dVar251 = dVar251 * dVar288 * dVar21 * 0.125;
        dVar323 = 0.0;
        if (dVar1 < local_d28) {
          dVar323 = dVar22 * p->cam_beta * dVar99 * dVar117 +
                    dVar119 * dVar66 +
                    dVar109 * dVar65 * dVar117 + (dVar55 * -0.375 * dVar170 - dVar68) + dVar251;
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 2] = dVar323 * __x + dVar287 + pdVar3[lVar8 + 2];
        }
        dVar57 = (dVar57 * dVar82) / -12.0;
        if (dVar182 < 1.35) {
          dVar57 = (double)(~uVar17 & (ulong)dVar57);
          dVar57 = dVar114 * -2.6666666666666665 * dVar315 +
                   dVar205 * -2.6666666666666665 * dVar221 +
                   dVar57 * -2.6666666666666665 * dVar32 +
                   dVar144 * -2.6666666666666665 *
                   ((dVar57 * dVar31 * dVar34 +
                    dVar253 * dVar57 +
                    dVar205 * dVar33 * dVar84 +
                    dVar145 * dVar205 * -4.0 * dVar114 +
                    dVar91 * dVar114 * dVar155 * 0.25 +
                    dVar83 * dVar155 + dVar237 * dVar57 * dVar34 * 0.5) * dVar92 +
                   dVar58 * dVar317 +
                   dVar166 * dVar327 +
                   (dVar57 + dVar57) * dVar183 +
                   dVar238 * dVar57 + dVar205 * dVar114 * dVar26 + dVar205 * dVar89 * dVar84 * 0.5);
        }
        else {
          dVar57 = (double)((ulong)dVar57 & uVar17);
          auVar74._0_8_ = dVar285 * local_438 * local_5e8;
          auVar74._8_8_ = dVar57 * dVar232;
          auVar304 = divpd(auVar74,_DAT_01033a40);
          auVar177._0_8_ = dVar57 * dVar212;
          auVar177._8_8_ = local_548 * local_438 * local_5e8;
          auVar121 = divpd(auVar177,_DAT_01033a50);
          auVar75._0_8_ = dStack_540 * local_438 * local_5e8;
          auVar75._8_8_ = dVar57 * dVar311;
          auVar278 = divpd(auVar75,_DAT_01033a60);
          auVar178._0_8_ = dVar57 * dVar299;
          auVar178._8_8_ = dVar207 * local_438 * local_5e8;
          auVar172 = divpd(auVar178,_DAT_01033a70);
          auVar76._0_8_ = dVar270 * local_438 * local_5e8;
          auVar76._8_8_ = dVar57 * dVar179;
          auVar69 = divpd(auVar76,_DAT_01033a80);
          auVar247._0_8_ = dVar57 * dVar156;
          auVar247._8_8_ = dVar312 * local_438 * local_5e8;
          auVar199 = divpd(auVar247,_DAT_01033a90);
          dVar57 = ((((((((((dVar57 * dVar298) / 240.0 +
                            (dVar252 * local_438 * local_5e8) / -48.0 +
                            (dVar325 * dVar57) / -18.0 + (dVar184 * local_438 * local_5e8) / 6.0 +
                           auVar304._0_8_) - auVar304._8_8_) - auVar121._8_8_) + auVar121._0_8_ +
                        auVar278._0_8_) - auVar278._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                     auVar69._0_8_) - auVar69._8_8_) - auVar199._8_8_) + auVar199._0_8_;
        }
        dVar22 = 0.0;
        if (dVar377 < dVar18) {
          dVar22 = dVar57 * p->cam_beta * dVar39 * dVar116 +
                   dVar358 * dVar197 +
                   dVar59 * dVar115 * dVar116 + (dVar215 * -0.375 * dVar276 - dVar141) + dVar30;
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          dVar57 = (pdVar3 + lVar8 + 3)[1];
          pdVar3[lVar8 + 3] = dVar22 * __x + dVar167 + pdVar3[lVar8 + 3];
          (pdVar3 + lVar8 + 3)[1] = dVar57 + 0.0;
        }
        dVar57 = dVar216 * dVar338;
        dVar22 = dVar188 * -2.6666666666666665 * dVar64 * dVar161 +
                 dVar81 * 5.333333333333333 * dVar60 * dVar139 * local_bd0 +
                 dVar259 * dVar216 * dVar148 +
                 dVar57 * -2.6666666666666665 * dVar27 +
                 dVar149 * dVar338 * dVar41 * dVar259 +
                 (pdVar2[2] * -2.6666666666666665 * dVar161 + dVar300 * -10.666666666666666 * dVar60
                 ) * dVar149 * dVar216;
        dVar27 = dVar375 * dVar22 * 0.25 +
                 dVar50 * dVar110 * dVar90 * dVar169 * dVar61 * -0.5 +
                 dVar181 * 2.519842099789747 * dVar20 * dVar180 * dVar169 * dVar61 +
                 (dVar163 * dVar88) / -12.0;
        if (dVar151 < 1.35) {
          dVar27 = (double)(~uVar12 & (ulong)dVar27);
          dVar120 = dVar101 * -2.6666666666666665 * dVar218 +
                    dVar138 * -2.6666666666666665 * dVar328 +
                    dVar27 * -2.6666666666666665 * dVar286 +
                    dVar35 * -2.6666666666666665 *
                    ((dVar27 * dVar44 * dVar47 +
                     dVar213 * dVar27 +
                     dVar138 * dVar46 * dVar120 +
                     dVar152 * dVar138 * -4.0 * dVar101 +
                     dVar96 * dVar101 * dVar102 * 0.25 +
                     dVar87 * dVar102 + dVar257 * dVar27 * dVar47 * 0.5) * dVar97 +
                    dVar261 * dVar241 +
                    dVar262 * dVar164 +
                    (dVar27 + dVar27) * dVar98 +
                    dVar258 * dVar27 +
                    dVar138 * dVar101 * dVar363 + dVar138 * dVar277 * dVar120 * 0.5);
        }
        else {
          dVar27 = (double)((ulong)dVar27 & uVar12);
          auVar77._0_8_ = dVar250 * local_428 * dVar62;
          auVar77._8_8_ = dVar27 * dVar335;
          auVar304 = divpd(auVar77,_DAT_01033a40);
          auVar248._0_8_ = dVar27 * dVar326;
          auVar248._8_8_ = local_538 * local_428 * dVar62;
          auVar121 = divpd(auVar248,_DAT_01033a50);
          auVar294._0_8_ = dStack_530 * local_428 * dVar62;
          auVar294._8_8_ = dVar27 * dVar373;
          auVar199 = divpd(auVar294,_DAT_01033a60);
          auVar249._0_8_ = dVar27 * dVar362;
          auVar249._8_8_ = dVar295 * local_428 * dVar62;
          auVar172 = divpd(auVar249,_DAT_01033a70);
          auVar78._0_8_ = dVar234 * local_428 * dVar62;
          auVar78._8_8_ = dVar27 * dVar361;
          auVar278 = divpd(auVar78,_DAT_01033a80);
          auVar230._0_8_ = dVar27 * dVar54;
          auVar230._8_8_ = dVar351 * local_428 * dVar62;
          auVar69 = divpd(auVar230,_DAT_01033a90);
          dVar120 = ((((((((((dVar27 * dVar240) / 240.0 +
                             (dVar210 * local_428 * dVar62) / -48.0 +
                             (dVar158 * dVar27) / -18.0 + (dVar45 * local_428 * dVar62) / 6.0 +
                            auVar304._0_8_) - auVar304._8_8_) - auVar121._8_8_) + auVar121._0_8_ +
                         auVar199._0_8_) - auVar199._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                      auVar278._0_8_) - auVar278._8_8_) - auVar69._8_8_) + auVar69._0_8_;
        }
        dVar27 = 0.0;
        if (dVar1 < local_d28) {
          dVar27 = dVar120 * p->cam_beta * dVar99 * dVar117 +
                   dVar111 * dVar288 * dVar117 +
                   dVar251 + dVar219 * 0.375 * dVar66 +
                             dVar316 * dVar65 * dVar117 +
                             ((dVar219 * -0.375 * dVar170 - dVar68) -
                             dVar22 * dVar24 * dVar191 * dVar117);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2rhosigma * sVar10;
          pdVar3[lVar8 + 5] = dVar27 * __x + dVar287 + pdVar3[lVar8 + 5];
        }
        dVar120 = pdVar2[3];
        dVar22 = dVar25 * -2.0 * (dVar104 / dVar143) * dVar139 * dVar140 +
                 (dVar153 + dVar153) * dVar140 * dVar120 * dVar86 +
                 (dVar19 + dVar19) * dVar85 + dVar301 * dVar301 * dVar86 * dVar242;
        dVar19 = dVar113 * dVar22 * 0.25 +
                 dVar142 * dVar206 * dVar220 * dVar220 + dVar28 * dVar51 * dVar220 * dVar220 * -0.5;
        if (dVar182 < 1.35) {
          dVar19 = (double)(~uVar17 & (ulong)dVar19);
          dVar25 = dVar114 * dVar114;
          dVar19 = dVar144 * -2.6666666666666665 *
                   (dVar92 * (dVar31 * dVar19 * dVar34 +
                             dVar253 * dVar19 +
                             dVar33 * dVar25 * dVar34 +
                             dVar25 * -4.0 * dVar145 +
                             dVar91 * dVar25 * dVar34 * 0.25 +
                             dVar29 * dVar25 * dVar34 + dVar237 * dVar19 * dVar34 * 0.5) +
                   dVar114 * 4.0 * dVar317 +
                   (dVar19 + dVar19) * dVar183 +
                   dVar238 * dVar19 + dVar26 * dVar25 + dVar89 * dVar25 * dVar34 * 0.5) +
                   dVar19 * -2.6666666666666665 * dVar32 + dVar114 * -5.333333333333333 * dVar221;
        }
        else {
          dVar19 = (double)(uVar17 & (ulong)dVar19);
          local_438 = local_438 * local_438;
          auVar371._0_8_ = dVar285 * local_438;
          auVar371._8_8_ = dVar232 * dVar19;
          auVar199 = divpd(auVar371,_DAT_01033a40);
          auVar322._0_8_ = dVar212 * dVar19;
          auVar322._8_8_ = local_548 * local_438;
          auVar172 = divpd(auVar322,_DAT_01033a50);
          auVar269._0_8_ = dStack_540 * local_438;
          auVar269._8_8_ = dVar311 * dVar19;
          auVar69 = divpd(auVar269,_DAT_01033a60);
          auVar79._0_8_ = dVar299 * dVar19;
          auVar79._8_8_ = dVar207 * local_438;
          auVar304 = divpd(auVar79,_DAT_01033a70);
          auVar310._0_8_ = dVar270 * local_438;
          auVar310._8_8_ = dVar179 * dVar19;
          auVar121 = divpd(auVar310,_DAT_01033a80);
          auVar80._0_8_ = dVar156 * dVar19;
          auVar80._8_8_ = dVar312 * local_438;
          auVar278 = divpd(auVar80,_DAT_01033a90);
          dVar19 = ((((((((((dVar298 * dVar19) / 240.0 +
                            (dVar252 * local_438) / -48.0 +
                            (dVar325 * dVar19) / -18.0 + (dVar184 * local_438) / 6.0 +
                           auVar199._0_8_) - auVar199._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                        auVar69._0_8_) - auVar69._8_8_) - auVar304._8_8_) + auVar304._0_8_ +
                     auVar121._0_8_) - auVar121._8_8_) - auVar278._8_8_) + auVar278._0_8_;
        }
        dVar25 = 0.0;
        if (dVar377 < dVar18) {
          dVar25 = dVar116 * dVar39 * dVar19 * p->cam_beta +
                   dVar36 * dVar40 * dVar22 * dVar24 + dVar23 * 0.75 * dVar115 * dVar168;
        }
        pdVar3 = out->v2sigma2;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          dVar18 = (pdVar3 + lVar8)[1];
          dVar377 = pdVar3[lVar8 + 2];
          dVar120 = (pdVar3 + lVar8 + 2)[1];
          pdVar3[lVar8] = pdVar3[lVar8] + dVar25 * __x;
          (pdVar3 + lVar8)[1] = dVar18 + 0.0;
          pdVar3[lVar8 + 2] = dVar377 + 0.0;
          (pdVar3 + lVar8 + 2)[1] = dVar120 + 0.0;
          pdVar3[lVar8 + 4] = pdVar3[lVar8 + 4] + 0.0;
          dVar120 = pdVar2[3];
        }
        dVar18 = (dVar216 + dVar216) * dVar120 * dVar186 * dVar149 +
                 (dVar57 + dVar57) * dVar148 +
                 dVar41 * dVar338 * dVar338 * dVar149 +
                 dVar188 * -2.0 * (dVar260 / dVar209) * dVar139 * dVar186;
        dVar377 = dVar375 * dVar18 * 0.25 +
                  dVar38 * dVar169 * dVar169 + dVar217 * dVar169 * dVar169 * -0.5;
        if (dVar151 < 1.35) {
          dVar377 = (double)(~uVar12 & (ulong)dVar377);
          dVar120 = dVar101 * dVar101;
          dVar377 = dVar35 * -2.6666666666666665 *
                    (dVar97 * (dVar44 * dVar377 * dVar47 +
                              dVar213 * dVar377 +
                              dVar46 * dVar120 * dVar47 +
                              dVar120 * -4.0 * dVar152 +
                              dVar96 * dVar120 * dVar47 * 0.25 +
                              dVar67 * dVar120 * dVar47 + dVar257 * dVar377 * dVar47 * 0.5) +
                    dVar101 * 4.0 * dVar241 +
                    (dVar377 + dVar377) * dVar98 +
                    dVar258 * dVar377 + dVar363 * dVar120 + dVar277 * dVar120 * dVar47 * 0.5) +
                    dVar377 * -2.6666666666666665 * dVar286 + dVar101 * -5.333333333333333 * dVar328
          ;
        }
        else {
          dVar377 = (double)(uVar12 & (ulong)dVar377);
          local_428 = local_428 * local_428;
          auVar136._0_8_ = dVar250 * local_428;
          auVar136._8_8_ = dVar335 * dVar377;
          auVar304 = divpd(auVar136,_DAT_01033a40);
          auVar284._0_8_ = dVar326 * dVar377;
          auVar284._8_8_ = local_538 * local_428;
          auVar172 = divpd(auVar284,_DAT_01033a50);
          auVar231._0_8_ = dStack_530 * local_428;
          auVar231._8_8_ = dVar373 * dVar377;
          auVar121 = divpd(auVar231,_DAT_01033a60);
          auVar204._0_8_ = dVar362 * dVar377;
          auVar204._8_8_ = dVar295 * local_428;
          auVar69 = divpd(auVar204,_DAT_01033a70);
          auVar372._0_8_ = dVar234 * local_428;
          auVar372._8_8_ = dVar361 * dVar377;
          auVar199 = divpd(auVar372,_DAT_01033a80);
          auVar137._0_8_ = dVar54 * dVar377;
          auVar137._8_8_ = dVar351 * local_428;
          auVar278 = divpd(auVar137,_DAT_01033a90);
          dVar377 = ((((((((((dVar240 * dVar377) / 240.0 +
                             (dVar210 * local_428) / -48.0 +
                             (dVar158 * dVar377) / -18.0 + (dVar45 * local_428) / 6.0 +
                            auVar304._0_8_) - auVar304._8_8_) - auVar172._8_8_) + auVar172._0_8_ +
                         auVar121._0_8_) - auVar121._8_8_) - auVar69._8_8_) + auVar69._0_8_ +
                      auVar199._0_8_) - auVar199._8_8_) - auVar278._8_8_) + auVar278._0_8_;
        }
        dVar120 = 0.0;
        if (dVar1 < local_d28) {
          dVar120 = dVar117 * dVar99 * dVar377 * p->cam_beta +
                    dVar48 * dVar191 * dVar24 * dVar18 + dVar21 * 0.75 * dVar65 * dVar288;
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar8 = (long)(p->dim).v2sigma2 * sVar10;
          pdVar3[lVar8 + 5] = __x * dVar120 + pdVar3[lVar8 + 5];
        }
      }
      sVar10 = sVar10 + 1;
    } while (np != sVar10);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}